

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::isInt(Value *this)

{
  bool bVar1;
  double dVar2;
  long val;
  double integral_part;
  long local_38;
  string local_30;
  
  switch(this->field_0x8) {
  case 1:
  case 3:
    local_38 = (this->value_).int_;
    goto LAB_0011ae4e;
  case 2:
    bVar1 = (this->value_).uint_ >> 0x1f == 0;
    break;
  case 4:
    dVar2 = (this->value_).real_;
    bVar1 = false;
    if ((-2147483648.0 <= dVar2) && (dVar2 <= 2147483647.0)) {
      dVar2 = modf(dVar2,(double *)&local_30);
      bVar1 = (bool)(-(dVar2 == 0.0) & 1);
    }
    break;
  case 5:
    asString_abi_cxx11_(&local_30,this);
    bVar1 = converToInt(local_30._M_dataplus._M_p,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    if (!bVar1) goto switchD_0011ae13_default;
LAB_0011ae4e:
    bVar1 = (int)local_38 == local_38;
    break;
  default:
switchD_0011ae13_default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Value::isInt() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    return value_.int_ >= minInt && value_.int_ <= maxInt;
  case uintValue:
    return value_.uint_ <= UInt(maxInt);
  case realValue:
    return value_.real_ >= minInt && value_.real_ <= maxInt &&
           IsIntegral(value_.real_);
  case stringValue:
    long int val;

    if (!converToInt (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, minInt, maxInt);
  default:
    break;
  }
  return false;
}